

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdTest(uint *pTruth,int nVars)

{
  long lVar1;
  long lVar2;
  Kit_DsdNtk_t *p;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdMan_t *p_00;
  uint *puVar3;
  ulong uVar4;
  
  p = Kit_DsdDecomposeInt(pTruth,nVars,0);
  pNtk = Kit_DsdExpand(p);
  Kit_DsdNtkFree(p);
  Kit_DsdPrint(_stdout,pNtk);
  putchar(10);
  p_00 = Kit_DsdManAlloc(nVars,(uint)pNtk->nNodes + (uint)pNtk->nVars);
  puVar3 = Kit_DsdTruthCompute(p_00,pNtk);
  uVar4 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar4 = 1;
  }
  do {
    if ((int)uVar4 < 1) goto LAB_005d780e;
    lVar1 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (pTruth[lVar1] == puVar3[lVar2]);
  puts("Verification failed.");
LAB_005d780e:
  Kit_DsdManFree(p_00);
  Kit_DsdNtkFree(pNtk);
  return;
}

Assistant:

void Kit_DsdTest( unsigned * pTruth, int nVars )
{
    Kit_DsdMan_t * p;
    unsigned * pTruthC;
    Kit_DsdNtk_t * pNtk, * pTemp;
    pNtk = Kit_DsdDecompose( pTruth, nVars );

//    if ( Kit_DsdFindLargeBox(pNtk, Abc_Lit2Var(pNtk->Root)) )
//        Kit_DsdPrint( stdout, pNtk );

//    if ( Kit_DsdNtkRoot(pNtk)->nFans == (unsigned)nVars && nVars == 6 )

//    printf( "\n" );
//    Kit_DsdPrint( stdout, pNtk );

    pNtk = Kit_DsdExpand( pTemp = pNtk );
    Kit_DsdNtkFree( pTemp );

    Kit_DsdPrint( stdout, pNtk ), printf( "\n" );

//    if ( Kit_DsdFindLargeBox(pNtk, Abc_Lit2Var(pNtk->Root)) )
//        Kit_DsdTestCofs( pNtk, pTruth );

    // recompute the truth table
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
//    Extra_PrintBinary( stdout, pTruth, 1 << nVars ); printf( "\n" );
//    Extra_PrintBinary( stdout, pTruthC, 1 << nVars ); printf( "\n" );
    if ( Extra_TruthIsEqual( pTruth, pTruthC, nVars ) )
    {
//        printf( "Verification is okay.\n" );
    }
    else
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );


    Kit_DsdNtkFree( pNtk );
}